

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::Path::Path(Path *this,ArrayPtr<const_kj::StringPtr> parts)

{
  String *pSVar1;
  String *pSVar2;
  size_t sVar3;
  StringPtr *pSVar4;
  StringPtr *pSVar5;
  ArrayBuilder<kj::String> builder;
  Array<kj::String> result;
  String *pSVar6;
  String *pSVar7;
  Array<kj::String> local_58;
  String local_38;
  
  sVar3 = parts.size_;
  pSVar4 = parts.ptr;
  pSVar2 = (String *)
           _::HeapArrayDisposer::allocateImpl
                     (0x18,0,sVar3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar7 = pSVar2 + sVar3;
  pSVar6 = pSVar2;
  if (sVar3 != 0) {
    pSVar5 = pSVar4 + sVar3;
    do {
      heapString(&local_38,(pSVar4->content).ptr,(pSVar4->content).size_ - 1);
      (pSVar6->content).ptr = local_38.content.ptr;
      (pSVar6->content).size_ = local_38.content.size_;
      (pSVar6->content).disposer = local_38.content.disposer;
      pSVar6 = pSVar6 + 1;
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar5);
  }
  local_58.size_ = ((long)pSVar6 - (long)pSVar2 >> 3) * -0x5555555555555555;
  local_58.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.ptr = pSVar2;
  Path(this,&local_58);
  sVar3 = local_58.size_;
  pSVar1 = local_58.ptr;
  if (local_58.ptr != (String *)0x0) {
    local_58.ptr = (String *)0x0;
    local_58.size_ = 0;
    (**(local_58.disposer)->_vptr_ArrayDisposer)
              (local_58.disposer,pSVar1,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct,pSVar2,pSVar6,pSVar7);
  }
  return;
}

Assistant:

Path::Path(ArrayPtr<const StringPtr> parts)
    : Path(KJ_MAP(p, parts) { return heapString(p); }) {}